

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O0

Time absl::Now(void)

{
  int64_t n_00;
  Duration DVar1;
  Time TVar2;
  Duration d;
  Duration d_00;
  int64_t n;
  undefined4 local_10;
  
  n_00 = GetCurrentTimeNanos();
  if (n_00 < 0) {
    DVar1 = Nanoseconds<long,_0>(n_00);
    d_00._8_8_ = DVar1._8_8_;
    d_00.rep_hi_ = (ulong)DVar1.rep_lo_;
    TVar2 = time_internal::FromUnixDuration((time_internal *)DVar1.rep_hi_,d_00);
    n = TVar2.rep_.rep_hi_;
    local_10 = TVar2.rep_.rep_lo_;
  }
  else {
    DVar1 = time_internal::MakeDuration(n_00 / 1000000000,(n_00 % 1000000000) * 4);
    d._8_8_ = DVar1._8_8_;
    d.rep_hi_ = (ulong)DVar1.rep_lo_;
    TVar2 = time_internal::FromUnixDuration((time_internal *)DVar1.rep_hi_,d);
    n = TVar2.rep_.rep_hi_;
    local_10 = TVar2.rep_.rep_lo_;
  }
  TVar2.rep_.rep_lo_ = local_10;
  TVar2.rep_.rep_hi_ = n;
  TVar2.rep_._12_4_ = 0;
  return (Time)TVar2.rep_;
}

Assistant:

ABSL_NAMESPACE_BEGIN
Time Now() {
  // TODO(bww): Get a timespec instead so we don't have to divide.
  int64_t n = absl::GetCurrentTimeNanos();
  if (n >= 0) {
    return time_internal::FromUnixDuration(
        time_internal::MakeDuration(n / 1000000000, n % 1000000000 * 4));
  }
  return time_internal::FromUnixDuration(absl::Nanoseconds(n));
}